

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  element_type *peVar1;
  Model *model_00;
  FastText *this_00;
  element_type *this_01;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<int,_std::allocator<int>_> *line_00;
  __int_type _Var3;
  int in_ESI;
  Dictionary *in_RDI;
  float fVar4;
  float fVar5;
  real lr;
  real progress;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  Model model;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffb68;
  real in_stack_fffffffffffffb6c;
  Model *in_stack_fffffffffffffb70;
  int32_t in_stack_fffffffffffffb78;
  int32_t in_stack_fffffffffffffb7c;
  int32_t in_stack_fffffffffffffb80;
  float in_stack_fffffffffffffb84;
  Model *model_01;
  FastText *this_02;
  entry_type type;
  undefined1 *this_03;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbe0;
  istream *in_stack_fffffffffffffbe8;
  Dictionary *in_stack_fffffffffffffbf0;
  istream *in_stack_fffffffffffffbf8;
  Dictionary *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc10;
  int32_t seed;
  Model *__i;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffc18;
  vector<int,_std::allocator<int>_> *line_01;
  undefined4 in_stack_fffffffffffffc20;
  real in_stack_fffffffffffffc24;
  Model *in_stack_fffffffffffffc28;
  Model *in_stack_fffffffffffffc30;
  undefined1 local_3a0 [32];
  Model local_380;
  undefined1 local_218 [524];
  int local_c;
  
  seed = (int32_t)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  local_c = in_ESI;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16dc18);
  this_03 = local_218;
  std::ifstream::ifstream(this_03,(string *)peVar1,_S_in);
  model_00 = (Model *)(long)local_c;
  this_00 = (FastText *)utils::size((ifstream *)in_stack_fffffffffffffb70);
  type = (entry_type)((ulong)((long)model_00 * (long)this_00) >> 0x38);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16dc6d);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  model_01 = (Model *)(local_3a0 + 0x10);
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            (&in_stack_fffffffffffffb70->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  this_02 = (FastText *)local_3a0;
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            (&in_stack_fffffffffffffb70->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  std::shared_ptr<fasttext::Args>::shared_ptr
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffb70,
             (shared_ptr<fasttext::Args> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Model::Model(in_stack_fffffffffffffc30,&in_stack_fffffffffffffc28->wi_,
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,seed);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x16dd10);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16dd1d);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16dd2a);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16dd34);
  if (peVar1->model == sup) {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16dd4c);
    Dictionary::getCounts(in_RDI,type);
    Model::setTargetCounts
              (in_stack_fffffffffffffb70,
               (vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  }
  else {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16de32);
    Dictionary::getCounts(in_RDI,type);
    Model::setTargetCounts
              (in_stack_fffffffffffffb70,
               (vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  }
  this_01 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16dea0);
  pvVar2 = (vector<int,_std::allocator<int>_> *)Dictionary::ntokens(this_01);
  __i = (Model *)0x0;
  line_01 = pvVar2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16ded5);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16dedf);
  while( true ) {
    line_00 = (vector<int,_std::allocator<int>_> *)
              std::__atomic_base::operator_cast_to_long
                        ((__atomic_base<long> *)
                         CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16defc);
    if ((long)peVar1->epoch * (long)line_01 <= (long)line_00) break;
    _Var3 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffb84 = (float)_Var3;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16df3d);
    fVar4 = in_stack_fffffffffffffb84 / (float)((long)peVar1->epoch * (long)line_01);
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16df69);
    fVar5 = (float)(peVar1->lr * (1.0 - (double)fVar4));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16df9c);
    if (peVar1->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16dfb4);
      in_stack_fffffffffffffb80 =
           Dictionary::getLine(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffb70 =
           (Model *)((long)&(__i->wi_).
                            super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + (long)in_stack_fffffffffffffb80);
      supervised(this_02,model_01,(real)((ulong)pvVar2 >> 0x20),line_00,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    }
    else {
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16e057);
      if (peVar1->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16e06b);
        in_stack_fffffffffffffb7c =
             Dictionary::getLine(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                 in_stack_fffffffffffffbe0,(minstd_rand *)CONCAT44(fVar4,fVar5));
        in_stack_fffffffffffffb70 =
             (Model *)((long)&(__i->wi_).
                              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + (long)in_stack_fffffffffffffb7c);
        cbow((FastText *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc24,line_01);
      }
      else {
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16e0dc);
        in_stack_fffffffffffffb70 = __i;
        if (peVar1->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16e0f0);
          in_stack_fffffffffffffb78 =
               Dictionary::getLine(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                   in_stack_fffffffffffffbe0,(minstd_rand *)CONCAT44(fVar4,fVar5));
          in_stack_fffffffffffffb70 =
               (Model *)((long)&(__i->wi_).
                                super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + (long)in_stack_fffffffffffffb78);
          skipgram(this_00,model_00,(real)((ulong)this_03 >> 0x20),
                   (vector<int,_std::allocator<int>_> *)in_RDI);
        }
      }
    }
    __i = in_stack_fffffffffffffb70;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16e16f);
    if ((long)peVar1->lrUpdateRate < (long)in_stack_fffffffffffffb70) {
      std::__atomic_base<long>::operator+=
                ((__atomic_base<long> *)&in_RDI->pruneidx_size_,(__int_type)__i);
      __i = (Model *)0x0;
      if ((local_c == 0) &&
         (peVar1 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16e1b6), 1 < peVar1->verbose)) {
        in_stack_fffffffffffffb6c = Model::getLoss(&local_380);
        std::atomic<float>::operator=
                  ((atomic<float> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
      }
    }
  }
  if (local_c == 0) {
    Model::getLoss(&local_380);
    std::atomic<float>::operator=
              ((atomic<float> *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Model::~Model(in_stack_fffffffffffffb70);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model model(input_, output_, args_, threadId);
  if (args_->model == model_name::sup) {
    model.setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model.setTargetCounts(dict_->getCounts(entry_type::word));
  }

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount_ < args_->epoch * ntokens) {
    real progress = real(tokenCount_) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    if (args_->model == model_name::sup) {
      localTokenCount += dict_->getLine(ifs, line, labels);
      supervised(model, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      localTokenCount += dict_->getLine(ifs, line, model.rng);
      cbow(model, lr, line);
    } else if (args_->model == model_name::sg) {
      localTokenCount += dict_->getLine(ifs, line, model.rng);
      skipgram(model, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount_ += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1)
        loss_ = model.getLoss();
    }
  }
  if (threadId == 0)
    loss_ = model.getLoss();
  ifs.close();
}